

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pair<const_std::pair<const_int,_double>_*,_const_std::pair<const_int,_double>_*>
frozen::map<int,double,1ul,std::less<int>>::
equal_range_impl<frozen::map<int,double,1ul,std::less<int>>const&,int>
          (map<int,_double,_1UL,_std::less<int>_> *self,int *key)

{
  int iVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  value_compare *this;
  const_iterator local_38;
  const_iterator local_30;
  const_iterator lower;
  int *key_local;
  map<int,_double,_1UL,_std::less<int>_> *self_local;
  
  lower = (const_iterator)key;
  key_local = (int *)self;
  pvVar2 = map<int,_double,_1UL,_std::less<int>_>::lower_bound<int>(self,key);
  local_30 = pvVar2;
  pvVar3 = map<int,_double,_1UL,_std::less<int>_>::end
                     ((map<int,_double,_1UL,_std::less<int>_> *)key_local);
  if (pvVar2 != pvVar3) {
    this = map<int,_double,_1UL,_std::less<int>_>::value_comp
                     ((map<int,_double,_1UL,_std::less<int>_> *)key_local);
    iVar1 = impl::CompareKey<std::less<int>>::operator()(this,&lower->first,local_30);
    if (iVar1 == 0) {
      local_38 = local_30 + 1;
      std::pair<const_std::pair<const_int,_double>_*,_const_std::pair<const_int,_double>_*>::
      pair<const_std::pair<const_int,_double>_*&,_const_std::pair<const_int,_double>_*,_true>
                ((pair<const_std::pair<const_int,_double>_*,_const_std::pair<const_int,_double>_*> *
                 )&self_local,&local_30,&local_38);
      return _self_local;
    }
  }
  std::pair<const_std::pair<const_int,_double>_*,_const_std::pair<const_int,_double>_*>::
  pair<const_std::pair<const_int,_double>_*&,_const_std::pair<const_int,_double>_*&,_true>
            ((pair<const_std::pair<const_int,_double>_*,_const_std::pair<const_int,_double>_*> *)
             &self_local,&local_30,&local_30);
  return _self_local;
}

Assistant:

static inline constexpr auto equal_range_impl(This&& self, KeyType const &key) {
    auto lower = self.lower_bound(key);
    using lower_t = decltype(lower);
    if (lower != self.end() && !self.value_comp()(key, *lower))
      return std::pair<lower_t, lower_t>{lower, lower + 1};
    else
      return std::pair<lower_t, lower_t>{lower, lower};
  }